

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_header(HEADER_HANDLE header)

{
  HEADER_INSTANCE *header_instance;
  AMQP_VALUE result;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance = (HEADER_INSTANCE *)0x0;
  }
  else {
    header_instance = (HEADER_INSTANCE *)amqpvalue_clone(header->composite_value);
  }
  return (AMQP_VALUE)header_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_header(HEADER_HANDLE header)
{
    AMQP_VALUE result;

    if (header == NULL)
    {
        result = NULL;
    }
    else
    {
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        result = amqpvalue_clone(header_instance->composite_value);
    }

    return result;
}